

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
::_reduce_column_by(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                    *this,Index target,Index source)

{
  uint uVar1;
  node_ptr plVar2;
  Zp_field_operators<unsigned_int,_void> *this_00;
  int iVar3;
  Column *targetColumn;
  Column *source_00;
  uint uVar4;
  uint local_38;
  Index local_34;
  
  local_34 = source;
  targetColumn = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
                 ::_get_column(&this->reducedMatrixR_,target);
  source_00 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
              ::_get_column(&this->reducedMatrixR_,source);
  plVar2 = (source_00->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  uVar4 = 0;
  if (plVar2 != (node_ptr)&source_00->column_ && plVar2 != (node_ptr)0x0) {
    uVar4 = *(uint *)((long)&(source_00->column_).super_type.data_.root_plus_size_.m_header.
                             super_node.prev_[-1].prev_ + 4);
  }
  this_00 = this->operators_;
  uVar1 = this_00->characteristic_;
  if (uVar1 <= uVar4) {
    uVar4 = uVar4 % uVar1;
  }
  _local_38 = CONCAT44(local_34,(this_00->inverse_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar4]);
  plVar2 = (targetColumn->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  iVar3 = 0;
  if (plVar2 != (node_ptr)&targetColumn->column_ && plVar2 != (node_ptr)0x0) {
    iVar3 = *(int *)((long)&(targetColumn->column_).super_type.data_.root_plus_size_.m_header.
                            super_node.prev_[-1].prev_ + 4);
  }
  persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
            (this_00,&local_38,uVar1 - iVar3);
  _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true,false>>>>
            (&local_38,source_00,targetColumn);
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_false>_>_>
  ::multiply_source_and_add_to<unsigned_int>(&this->mirrorMatrixU_,&local_38,&local_34,target);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column_by(Index target, Index source)
{
  Column& curr = reducedMatrixR_.get_column(target);
  if constexpr (Master_matrix::Option_list::is_z2) {
    curr += reducedMatrixR_.get_column(source);
    // to avoid having to do line operations during vineyards, U is transposed
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.get_column(source).push_back(*mirrorMatrixU_.get_column(target).begin());
  } else {
    Column& toadd = reducedMatrixR_.get_column(source);
    Field_element coef = toadd.get_pivot_value();
    coef = operators_->get_inverse(coef);
    operators_->multiply_inplace(coef, operators_->get_characteristic() - curr.get_pivot_value());

    curr.multiply_source_and_add(toadd, coef);
    // but no transposition for Zp, careful if there will be vineyard or rep cycles in Zp one day
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.multiply_source_and_add_to(coef, source, target);
  }
}